

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c
# Opt level: O0

opj_thread_t * opj_thread_create(opj_thread_fn thread_fn,void *user_data)

{
  int iVar1;
  opj_thread_t *thread;
  pthread_attr_t attr;
  void *user_data_local;
  opj_thread_fn thread_fn_local;
  
  attr._48_8_ = user_data;
  user_data_local = thread_fn;
  if (thread_fn == (opj_thread_fn)0x0) {
    __assert_fail("thread_fn",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/thread.c"
                  ,0x191,"opj_thread_t *opj_thread_create(opj_thread_fn, void *)");
  }
  thread_fn_local = (opj_thread_fn)opj_malloc(0x18);
  if (thread_fn_local == (opj_thread_fn)0x0) {
    thread_fn_local = (opj_thread_fn)0x0;
  }
  else {
    *(void **)thread_fn_local = user_data_local;
    *(undefined8 *)(thread_fn_local + 8) = attr._48_8_;
    pthread_attr_init((pthread_attr_t *)&thread);
    pthread_attr_setdetachstate((pthread_attr_t *)&thread,0);
    iVar1 = pthread_create((pthread_t *)(thread_fn_local + 0x10),(pthread_attr_t *)&thread,
                           opj_thread_callback_adapter,thread_fn_local);
    if (iVar1 != 0) {
      opj_free(thread_fn_local);
      thread_fn_local = (opj_thread_fn)0x0;
    }
  }
  return (opj_thread_t *)thread_fn_local;
}

Assistant:

opj_thread_t* opj_thread_create(opj_thread_fn thread_fn, void* user_data)
{
    pthread_attr_t attr;
    opj_thread_t* thread;

    assert(thread_fn);

    thread = (opj_thread_t*) opj_malloc(sizeof(opj_thread_t));
    if (!thread) {
        return NULL;
    }
    thread->thread_fn = thread_fn;
    thread->user_data = user_data;

    pthread_attr_init(&attr);
    pthread_attr_setdetachstate(&attr, PTHREAD_CREATE_JOINABLE);
    if (pthread_create(&(thread->thread), &attr,
                       opj_thread_callback_adapter, (void *) thread) != 0) {
        opj_free(thread);
        return NULL;
    }
    return thread;
}